

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_exp.h
# Opt level: O0

void __thiscall
trento::FastExp<double>::FastExp(FastExp<double> *this,double xmin,double xmax,size_t nsteps)

{
  reference pvVar1;
  allocator_type *in_RSI;
  double *in_RDI;
  double in_XMM0_Qa;
  double dVar2;
  undefined1 auVar3 [16];
  double in_XMM1_Qa;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  size_t i;
  undefined1 *__n;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffc0;
  allocator_type *__n_00;
  undefined1 local_21;
  allocator_type *local_20;
  undefined1 auVar4 [64];
  
  *in_RDI = in_XMM0_Qa;
  in_RDI[1] = in_XMM1_Qa;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = in_XMM0_Qa;
  auVar5 = vcvtusi2sd_avx512f(auVar5,in_RSI + -1);
  dVar2 = (in_XMM1_Qa - in_XMM0_Qa) / auVar5._0_8_;
  auVar4 = ZEXT864((ulong)dVar2);
  in_RDI[2] = dVar2;
  __n = &local_21;
  local_20 = in_RSI;
  std::allocator<double>::allocator((allocator<double> *)0x139b52);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_ffffffffffffffc0,(size_type)__n,in_RSI);
  std::allocator<double>::~allocator((allocator<double> *)0x139b72);
  for (__n_00 = (allocator_type *)0x0; __n_00 < local_20; __n_00 = __n_00 + 1) {
    auVar6._8_8_ = 0;
    auVar6._0_8_ = *in_RDI;
    auVar5 = vcvtusi2sd_avx512f(auVar4._0_16_,__n_00);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = in_RDI[2];
    auVar5 = vfmadd213sd_fma(auVar3,auVar5,auVar6);
    dVar2 = exp(auVar5._0_8_);
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 3),(size_type)__n_00);
    auVar4 = ZEXT864((ulong)dVar2);
    *pvVar1 = dVar2;
  }
  return;
}

Assistant:

FastExp<T>::FastExp(T xmin, T xmax, std::size_t nsteps)
    : xmin_(xmin),
      xmax_(xmax),
      dx_((xmax-xmin)/(nsteps-1)),
      table_(nsteps) {
  // Tabulate evenly-spaced exp() values.
  for (std::size_t i = 0; i < nsteps; ++i)
    table_[i] = std::exp(xmin_ + i*dx_);
}